

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O2

void __thiscall
VectorSUnitTest_element_access_at_Test::VectorSUnitTest_element_access_at_Test
          (VectorSUnitTest_element_access_at_Test *this)

{
  VectorSUnitTest::VectorSUnitTest(&this->super_VectorSUnitTest);
  (this->super_VectorSUnitTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_00169fb0;
  return;
}

Assistant:

TEST_F(VectorSUnitTest, element_access_at)
{
    vector_s<unsigned, 5> v{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, v.at(0));
    EXPECT_EQ(1u, v.at(1));
    EXPECT_EQ(2u, v.at(2));
    EXPECT_EQ(3u, v.at(3));
    EXPECT_EQ(4u, v.at(4));
    EXPECT_THROW(v.at(5), std::out_of_range);

    // const variant of at()
    const vector_s<unsigned, 5> vc{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, vc.at(0));
    EXPECT_EQ(1u, vc.at(1));
    EXPECT_EQ(2u, vc.at(2));
    EXPECT_EQ(3u, vc.at(3));
    EXPECT_EQ(4u, vc.at(4));
    EXPECT_THROW(vc.at(5), std::out_of_range);
}